

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
* __thiscall
testing::internal::
MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::
InternalExpectedAt(MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                   *this,char *file,int line,char *obj,char *call)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UntypedFunctionMockerBase *this_00;
  VTable *pVVar2;
  SharedPayloadBase *pSVar3;
  Sequence *this_01;
  long *plVar4;
  void *mock_obj;
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_02;
  Sequence **ppSVar5;
  long *plVar6;
  element_type *peVar7;
  size_type *psVar8;
  int line_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string source_text;
  string local_d0;
  string local_b0;
  Expectation local_90;
  undefined1 local_80 [24];
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"EXPECT_CALL(","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_80._16_8_ = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_80._16_8_ = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_80 + 0x10);
  peVar7 = (element_type *)(plVar4 + 2);
  if ((element_type *)*plVar4 == peVar7) {
    local_80._0_8_ = peVar7->_vptr_ExpectationBase;
    local_80._8_8_ = plVar4[3];
    local_90.expectation_base_.
    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_80;
  }
  else {
    local_80._0_8_ = peVar7->_vptr_ExpectationBase;
    local_90.expectation_base_.
    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar4;
  }
  local_90.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
  *plVar4 = (long)peVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_d0.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_90.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_80) {
    operator_delete(local_90.expectation_base_.
                    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_80._0_8_ + 1);
  }
  if ((long *)local_80._16_8_ != &local_60) {
    operator_delete((void *)local_80._16_8_,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  line_00 = (int)file;
  LogWithLocation(kInfo,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                  ,line_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->function_mocker_->super_UntypedFunctionMockerBase;
  mock_obj = UntypedFunctionMockerBase::MockObject(this_00);
  Mock::RegisterUseByOnCallOrExpectCall
            (mock_obj,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
             ,line_00);
  this_02 = (TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
             *)operator_new(0x140);
  ExpectationBase::ExpectationBase
            ((ExpectationBase *)this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
             ,line_00,&local_b0);
  (this_02->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001987d8;
  this_02->owner_ =
       (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
        *)this_00;
  (this_02->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
  ._M_head_impl.
  super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198218;
  pVVar2 = (this->matchers_).
           super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
           .
           super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
           ._M_head_impl.
           super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
           .vtable_;
  (this_02->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
  ._M_head_impl.
  super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>.
  vtable_ = pVVar2;
  (this_02->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
  ._M_head_impl.
  super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>.
  buffer_ = (this->matchers_).
            super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
            .
            super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
            ._M_head_impl.
            super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
            .buffer_;
  if ((pVVar2 != (VTable *)0x0) &&
     (pVVar2->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar3 = (this_02->matchers_).
             super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
             .
             super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
             ._M_head_impl.
             super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
             .buffer_.shared;
    LOCK();
    (pSVar3->ref).super___atomic_base<int>._M_i = (pSVar3->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this_02->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
  ._M_head_impl.
  super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001981a8;
  (this_02->extra_matcher_).
  super_MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  (this_02->extra_matcher_).
  super_MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198670;
  *(undefined8 *)&(this_02->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this_02->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this_02->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this_02->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  local_d0._M_string_length = 0;
  local_d0._M_dataplus._M_p = (pointer)this_02;
  local_d0._M_string_length = (size_type)operator_new(0x18);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00198820;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._M_string_length + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)this_02;
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&this_00->untyped_expectations_,(value_type *)&local_d0);
  ppSVar5 = ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_01 = *ppSVar5;
  if (this_01 != (Sequence *)0x0) {
    Expectation::Expectation(&local_90,(shared_ptr<testing::internal::ExpectationBase> *)&local_d0);
    Sequence::AddExpectation(this_01,&local_90);
    Expectation::~Expectation(&local_90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return this_02;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const std::string source_text(std::string("EXPECT_CALL(") + obj + ", " +
                                  call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }